

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

char * luaL_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  int t;
  lua_Integer lVar2;
  void *pvVar3;
  char *pcVar4;
  
  iVar1 = luaL_callmeta(L,idx,"__tostring");
  if (iVar1 != 0) {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      luaL_error(L,"\'__tostring\' must return a string");
    }
    goto LAB_001118a3;
  }
  iVar1 = lua_type(L,idx);
  switch(iVar1) {
  case 0:
    pcVar4 = "nil";
    goto LAB_001117ec;
  case 1:
    iVar1 = lua_toboolean(L,idx);
    pcVar4 = anon_var_dwarf_222;
    if (iVar1 == 0) {
      pcVar4 = anon_var_dwarf_217;
    }
LAB_001117ec:
    lua_pushstring(L,pcVar4);
    break;
  default:
    iVar1 = luaL_getmetafield(L,idx,"__name");
    if (iVar1 == 4) {
      pcVar4 = lua_tolstring(L,-1,(size_t *)0x0);
    }
    else {
      t = lua_type(L,idx);
      pcVar4 = lua_typename(L,t);
    }
    pvVar3 = lua_topointer(L,idx);
    lua_pushfstring(L,"%s: %p",pcVar4,pvVar3);
    if (iVar1 != 0) {
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
    }
    break;
  case 3:
    iVar1 = lua_isinteger(L,idx);
    if (iVar1 == 0) {
      lua_tonumberx(L,idx,(int *)0x0);
      lua_pushfstring(L,"%f");
    }
    else {
      lVar2 = lua_tointegerx(L,idx,(int *)0x0);
      lua_pushfstring(L,"%I",lVar2);
    }
    break;
  case 4:
    lua_pushvalue(L,idx);
  }
LAB_001118a3:
  pcVar4 = lua_tolstring(L,-1,len);
  return pcVar4;
}

Assistant:

LUALIB_API const char *luaL_tolstring (lua_State *L, int idx, size_t *len) {
  if (luaL_callmeta(L, idx, "__tostring")) {  /* metafield? */
    if (!lua_isstring(L, -1))
      luaL_error(L, "'__tostring' must return a string");
  }
  else {
    switch (lua_type(L, idx)) {
      case LUA_TNUMBER: {
        if (lua_isinteger(L, idx))
          lua_pushfstring(L, "%I", (LUAI_UACINT)lua_tointeger(L, idx));
        else
          lua_pushfstring(L, "%f", (LUAI_UACNUMBER)lua_tonumber(L, idx));
        break;
      }
      case LUA_TSTRING:
        lua_pushvalue(L, idx);
        break;
      case LUA_TBOOLEAN:
        lua_pushstring(L, (lua_toboolean(L, idx) ? "true" : "false"));
        break;
      case LUA_TNIL:
        lua_pushliteral(L, "nil");
        break;
      default: {
        int tt = luaL_getmetafield(L, idx, "__name");  /* try name */
        const char *kind = (tt == LUA_TSTRING) ? lua_tostring(L, -1) :
                                                 luaL_typename(L, idx);
        lua_pushfstring(L, "%s: %p", kind, lua_topointer(L, idx));
        if (tt != LUA_TNIL)
          lua_remove(L, -2);  /* remove '__name' */
        break;
      }
    }
  }
  return lua_tolstring(L, -1, len);
}